

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shape-description.cpp
# Opt level: O1

int msdfgen::readCharS(char **input)

{
  byte *pbVar1;
  int iVar2;
  ulong uVar3;
  
  pbVar1 = (byte *)*input;
  do {
    *input = (char *)(pbVar1 + 1);
    uVar3 = (ulong)*pbVar1;
    iVar2 = (int)(char)*pbVar1;
    if (0x20 < uVar3) {
      return iVar2;
    }
    pbVar1 = pbVar1 + 1;
  } while ((0x100002600U >> (uVar3 & 0x3f) & 1) != 0);
  if (uVar3 == 0) {
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int readCharS(const char **input) {
    int c = '\0';
    do {
        c = *(*input)++;
    } while (c == ' ' || c == '\t' || c == '\r' || c == '\n');
    if (!c) {
        --c;
        return EOF;
    }
    return c;
}